

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringLifting.cpp
# Opt level: O0

Pass * wasm::createStringLiftingPass(void)

{
  StringLifting *this;
  
  this = (StringLifting *)operator_new(0x120);
  memset(this,0,0x120);
  StringLifting::StringLifting(this);
  return &this->super_Pass;
}

Assistant:

Pass* createStringLiftingPass() { return new StringLifting(); }